

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summarycalc.cpp
# Opt level: O0

void __thiscall summarycalc::reset_sse_array(summarycalc *this)

{
  int iVar1;
  int iVar2;
  OASIS_FLOAT *pOVar3;
  int local_28;
  int j;
  int maxsummaryids;
  OASIS_FLOAT *se;
  int i;
  summarycalc *this_local;
  
  for (se._4_4_ = 0; se._4_4_ < 10; se._4_4_ = se._4_4_ + 1) {
    if (this->fout[se._4_4_] != (FILE *)0x0) {
      pOVar3 = this->sse[se._4_4_];
      iVar1 = this->max_summary_id_[se._4_4_];
      iVar2 = this->min_summary_id_[se._4_4_];
      for (local_28 = 0; local_28 <= (iVar1 - iVar2) + 1; local_28 = local_28 + 1) {
        pOVar3[local_28] = 0.0;
      }
    }
  }
  return;
}

Assistant:

void summarycalc::reset_sse_array()
{
	for (int i = 0; i < MAX_SUMMARY_SETS; i++) {
		if (fout[i] != nullptr) {
			OASIS_FLOAT *se = sse[i];		// f array of se[summary_id] to exposure
			int maxsummaryids = max_summary_id_[i] - min_summary_id_[i] + 1;
			for (int j = 0; j <= maxsummaryids; j++) {
				se[j] = 0;
			}
		}
	}
}